

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::EncryptionAlgorithm::EncryptionAlgorithm(EncryptionAlgorithm *this)

{
  AesGcmV1 *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__EncryptionAlgorithm_03540f48;
  *(undefined ***)in_RDI = &PTR__EncryptionAlgorithm_03540f48;
  AesGcmV1::AesGcmV1(in_RDI);
  AesGcmCtrV1::AesGcmCtrV1((AesGcmCtrV1 *)in_RDI);
  _EncryptionAlgorithm__isset::_EncryptionAlgorithm__isset
            ((_EncryptionAlgorithm__isset *)&((AesGcmCtrV1 *)in_RDI)[2].aad_prefix);
  return;
}

Assistant:

EncryptionAlgorithm::EncryptionAlgorithm() noexcept {
}